

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_splittingstep.c
# Opt level: O0

void * SplittingStepCreate(SUNStepper *steppers,int partitions,sunrealtype t0,N_Vector y0,
                          SUNContext_conflict sunctx)

{
  int iVar1;
  uint uVar2;
  SUNStepper *steppers_00;
  SUNStepper *in_RCX;
  ARKodeMem in_RDX;
  undefined4 in_ESI;
  sunrealtype in_XMM0_Qa;
  ARKodeSplittingStepMem step_mem;
  ARKodeMem ark_mem;
  int retval;
  N_Vector in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int init_type;
  undefined4 in_stack_ffffffffffffffe8;
  ARKodeMem local_8;
  
  iVar1 = splittingStep_CheckArgs(in_RDX,in_RCX,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc0)
  ;
  if (iVar1 == 0) {
    if (in_RCX == (SUNStepper *)0x0) {
      arkProcessError((ARKodeMem)0x0,-0x16,0x23c,"SplittingStepCreate",
                      "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                      ,"sunctx = NULL illegal.");
      local_8 = (ARKodeMem)0x0;
    }
    else {
      local_8 = arkCreate((SUNContext_conflict)(ulong)in_stack_ffffffffffffffc8);
      init_type = (int)((ulong)in_RCX >> 0x20);
      if (local_8 == (ARKodeMem)0x0) {
        arkProcessError((ARKodeMem)0x0,-0x15,0x245,"SplittingStepCreate",
                        "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                        ,"arkode_mem = NULL illegal.");
        local_8 = (ARKodeMem)0x0;
      }
      else {
        steppers_00 = (SUNStepper *)malloc(0x20);
        if (steppers_00 == (SUNStepper *)0x0) {
          arkProcessError(local_8,-0x14,0x24e,"SplittingStepCreate",
                          "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                          ,"Allocation of arkode_mem failed.");
          ARKodeFree(&local_8->sunctx);
          local_8 = (ARKodeMem)0x0;
        }
        else {
          *(undefined4 *)(steppers_00 + 3) = in_ESI;
          *(undefined4 *)((long)steppers_00 + 0x1c) = 0;
          *steppers_00 = (SUNStepper)0x0;
          steppers_00[2] = (SUNStepper)0x0;
          steppers_00[1] = (SUNStepper)0x0;
          iVar1 = splittingStep_InitStepMem
                            ((ARKodeMem)CONCAT44(iVar1,in_stack_ffffffffffffffc8),
                             (ARKodeSplittingStepMem)local_8,steppers_00,0);
          if (iVar1 == 0) {
            local_8->step_init = splittingStep_Init;
            local_8->step_fullrhs = splittingStep_FullRHS;
            local_8->step = splittingStep_TakeStep;
            local_8->step_printallstats = splittingStep_PrintAllStats;
            local_8->step_writeparameters = splittingStep_WriteParameters;
            local_8->step_free = splittingStep_Free;
            local_8->step_printmem = splittingStep_PrintMem;
            local_8->step_setdefaults = splittingStep_SetDefaults;
            local_8->step_setorder = splittingStep_SetOrder;
            local_8->step_mem = steppers_00;
            uVar2 = splittingStep_SetDefaults((ARKodeMem)(ulong)in_stack_ffffffffffffffc8);
            if (uVar2 == 0) {
              uVar2 = arkInit((ARKodeMem)CONCAT44(in_ESI,in_stack_ffffffffffffffe8),in_XMM0_Qa,
                              (N_Vector)in_RDX,init_type);
              if (uVar2 == 0) {
                ARKodeSetInterpolantType
                          ((void *)(ulong)in_stack_ffffffffffffffc8,(int)((ulong)local_8 >> 0x20));
              }
              else {
                arkProcessError(local_8,(int)(ulong)uVar2,0x27a,"SplittingStepCreate",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                                ,"Unable to initialize main ARKODE infrastructure");
                ARKodeFree(&local_8->sunctx);
                local_8 = (ARKodeMem)0x0;
              }
            }
            else {
              arkProcessError(local_8,(int)(ulong)uVar2,0x270,"SplittingStepCreate",
                              "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/arkode/arkode_splittingstep.c"
                              ,"Error setting default solver options");
              ARKodeFree(&local_8->sunctx);
              local_8 = (ARKodeMem)0x0;
            }
          }
          else {
            ARKodeFree(&local_8->sunctx);
            local_8 = (ARKodeMem)0x0;
          }
        }
      }
    }
  }
  else {
    local_8 = (ARKodeMem)0x0;
  }
  return local_8;
}

Assistant:

void* SplittingStepCreate(SUNStepper* steppers, int partitions, sunrealtype t0,
                          N_Vector y0, SUNContext sunctx)
{
  int retval = splittingStep_CheckArgs(NULL, steppers, partitions, y0);
  if (retval != ARK_SUCCESS) { return NULL; }

  if (sunctx == NULL)
  {
    arkProcessError(NULL, ARK_ILL_INPUT, __LINE__, __func__, __FILE__,
                    MSG_ARK_NULL_SUNCTX);
    return NULL;
  }

  /* Create ark_mem structure and set default values */
  ARKodeMem ark_mem = arkCreate(sunctx);
  if (ark_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARK_NO_MEM);
    return NULL;
  }

  ARKodeSplittingStepMem step_mem =
    (ARKodeSplittingStepMem)malloc(sizeof(*step_mem));
  if (step_mem == NULL)
  {
    arkProcessError(ark_mem, ARK_MEM_FAIL, __LINE__, __func__, __FILE__,
                    MSG_ARK_ARKMEM_FAIL);
    ARKodeFree((void**)&ark_mem);
    return NULL;
  }

  step_mem->partitions        = partitions;
  step_mem->order             = 0;
  step_mem->steppers          = NULL;
  step_mem->n_stepper_evolves = NULL;
  step_mem->coefficients      = NULL;
  retval = splittingStep_InitStepMem(ark_mem, step_mem, steppers, partitions);
  if (retval != ARK_SUCCESS)
  {
    ARKodeFree((void**)&ark_mem);
    return NULL;
  }

  /* Attach step_mem structure and function pointers to ark_mem */
  ark_mem->step_init            = splittingStep_Init;
  ark_mem->step_fullrhs         = splittingStep_FullRHS;
  ark_mem->step                 = splittingStep_TakeStep;
  ark_mem->step_printallstats   = splittingStep_PrintAllStats;
  ark_mem->step_writeparameters = splittingStep_WriteParameters;
  ark_mem->step_free            = splittingStep_Free;
  ark_mem->step_printmem        = splittingStep_PrintMem;
  ark_mem->step_setdefaults     = splittingStep_SetDefaults;
  ark_mem->step_setorder        = splittingStep_SetOrder;
  ark_mem->step_mem             = (void*)step_mem;

  /* Set default values for ARKStep optional inputs */
  retval = splittingStep_SetDefaults(ark_mem);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Error setting default solver options");
    ARKodeFree((void**)&ark_mem);
    return NULL;
  }

  /* Initialize main ARKODE infrastructure */
  retval = arkInit(ark_mem, t0, y0, FIRST_INIT);
  if (retval != ARK_SUCCESS)
  {
    arkProcessError(ark_mem, retval, __LINE__, __func__, __FILE__,
                    "Unable to initialize main ARKODE infrastructure");
    ARKodeFree((void**)&ark_mem);
    return NULL;
  }

  ARKodeSetInterpolantType(ark_mem, ARK_INTERP_LAGRANGE);

  return ark_mem;
}